

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *p_data,char *format)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  float fVar9;
  double dVar10;
  int arg0i;
  undefined4 uStack_54;
  float arg1f;
  uint uStack_4c;
  int arg1i;
  ImGuiDataTypeInfo *local_40;
  ImGuiDataTypeTempStorage data_backup;
  
  while( true ) {
    bVar1 = *buf;
    uVar8 = (ulong)bVar1;
    if (0x2f < uVar8) break;
    if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_00152849;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar7 = 0;
  bVar2 = bVar1;
LAB_00152862:
  if (bVar2 == 0) {
    return false;
  }
  local_40 = DataTypeGetInfo(data_type);
  memcpy(&data_backup,p_data,local_40->Size);
  if (format == (char *)0x0) {
    format = local_40->ScanFmt;
  }
  arg1i = 0;
  if (data_type == 9) {
    _arg0i = *p_data;
    _arg1f = 0.0;
    if ((bVar7 != 0) && (iVar5 = __isoc99_sscanf(initial_value_buf,"%lf",&arg0i), iVar5 < 1)) {
      return false;
    }
    iVar5 = __isoc99_sscanf(buf,"%lf",&arg1f);
    if (iVar5 < 1) {
      return false;
    }
    if (bVar7 == 0x2a) {
      dVar10 = _arg0i * _arg1f;
    }
    else if (bVar7 == 0x2f) {
      if ((_arg1f == 0.0) && (!NAN(_arg1f))) goto LAB_00152bcc;
      dVar10 = _arg0i / _arg1f;
    }
    else {
      dVar10 = _arg1f;
      if (bVar7 == 0x2b) {
        dVar10 = _arg0i + _arg1f;
      }
    }
    *(double *)p_data = dVar10;
    goto LAB_00152bcc;
  }
  if (data_type == 8) {
    _arg0i = (double)CONCAT44(uStack_54,*p_data);
    _arg1f = (double)((ulong)uStack_4c << 0x20);
    if ((bVar7 != 0) && (iVar5 = __isoc99_sscanf(initial_value_buf,"%f",&arg0i), iVar5 < 1)) {
      return false;
    }
    iVar5 = __isoc99_sscanf(buf,"%f",&arg1f);
    if (iVar5 < 1) {
      return false;
    }
    if (bVar7 == 0x2a) {
      fVar9 = (float)arg0i * arg1f;
    }
    else if (bVar7 == 0x2f) {
      if ((arg1f == 0.0) && (!NAN(arg1f))) goto LAB_00152bcc;
      fVar9 = (float)arg0i / arg1f;
    }
    else {
      fVar9 = arg1f;
      if (bVar7 == 0x2b) {
        fVar9 = (float)arg0i + arg1f;
      }
    }
    *(float *)p_data = fVar9;
    goto LAB_00152bcc;
  }
  if (data_type == 4) {
    _arg0i = (double)CONCAT44(uStack_54,*p_data);
    _arg1f = (double)((ulong)uStack_4c << 0x20);
    if (bVar7 == 0) {
LAB_00152a7e:
      iVar6 = __isoc99_sscanf(buf,format,&arg1i);
      iVar5 = arg1i;
      if (iVar6 != 1) goto LAB_00152bcc;
    }
    else {
      iVar5 = __isoc99_sscanf(initial_value_buf,format,&arg0i);
      if (iVar5 < 1) {
        return false;
      }
      if (bVar7 == 0x2a) {
        iVar5 = __isoc99_sscanf(buf,"%f",&arg1f);
        if (iVar5 == 0) goto LAB_00152bcc;
        iVar5 = (int)((float)arg0i * arg1f);
      }
      else if (bVar7 == 0x2f) {
        iVar5 = __isoc99_sscanf(buf,"%f",&arg1f);
        if (iVar5 == 0) goto LAB_00152bcc;
        if ((arg1f == 0.0) && (!NAN(arg1f))) goto LAB_00152bcc;
        iVar5 = (int)((float)arg0i / arg1f);
      }
      else {
        if (bVar7 != 0x2b) goto LAB_00152a7e;
        iVar5 = __isoc99_sscanf(buf,"%d",&arg1i);
        if (iVar5 == 0) goto LAB_00152bcc;
        iVar5 = arg1i + arg0i;
      }
    }
    *(int *)p_data = iVar5;
    goto LAB_00152bcc;
  }
  if (data_type - 5U < 3) {
    __isoc99_sscanf(buf,format,p_data);
    goto LAB_00152bcc;
  }
  __isoc99_sscanf(buf,format,&arg0i);
  switch(data_type) {
  case 0:
    iVar5 = 0x7f;
    if (arg0i < 0x7f) {
      iVar5 = arg0i;
    }
    uVar3 = 0x80;
    if (-0x80 < iVar5) {
      uVar3 = (undefined1)iVar5;
    }
    break;
  case 1:
    iVar5 = 0xff;
    if (arg0i < 0xff) {
      iVar5 = arg0i;
    }
    uVar3 = 0;
    if (0 < iVar5) {
      uVar3 = (undefined1)iVar5;
    }
    break;
  case 2:
    iVar5 = 0x7fff;
    if (arg0i < 0x7fff) {
      iVar5 = arg0i;
    }
    uVar4 = 0x8000;
    if (-0x8000 < iVar5) {
      uVar4 = (undefined2)iVar5;
    }
    goto LAB_00152ad3;
  case 3:
    iVar5 = 0xffff;
    if (arg0i < 0xffff) {
      iVar5 = arg0i;
    }
    uVar4 = 0;
    if (0 < iVar5) {
      uVar4 = (undefined2)iVar5;
    }
LAB_00152ad3:
    *(undefined2 *)p_data = uVar4;
    goto LAB_00152bcc;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x796,
                  "bool ImGui::DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                 );
  }
  *(undefined1 *)p_data = uVar3;
LAB_00152bcc:
  iVar5 = bcmp(&data_backup,p_data,local_40->Size);
  return iVar5 != 0;
LAB_00152849:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
      bVar2 = *buf;
    } while (bVar2 == 0x20);
    bVar7 = bVar1;
  } while (bVar2 == 9);
  goto LAB_00152862;
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)p_data;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)p_data;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)p_data;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        sscanf(buf, format, p_data);
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        sscanf(buf, format, &v32);
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}